

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_copy_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [32];
  char cVar4;
  long lVar5;
  CONV_BUF_TYPE *pCVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined2 uVar11;
  uint uVar12;
  undefined2 uVar13;
  int iVar14;
  CONV_BUF_TYPE *pCVar15;
  uint16_t *puVar16;
  uint16_t *puVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar33 [32];
  
  iVar14 = conv_params->round_0 + conv_params->round_1;
  cVar4 = (char)bd - (char)iVar14;
  uVar12 = 0xe - iVar14;
  iVar14 = (1 << (cVar4 + 0xdU & 0x1f)) + (1 << (cVar4 + 0xeU & 0x1f));
  iVar18 = (1 << ((byte)uVar12 & 0x1f)) >> 1;
  uVar13 = 0xff;
  if (bd == 0xc) {
    uVar13 = 0xfff;
  }
  pCVar6 = conv_params->dst;
  uVar11 = 0x3ff;
  if (bd != 10) {
    uVar11 = uVar13;
  }
  lVar20 = (long)conv_params->dst_stride;
  iVar2 = conv_params->do_average;
  iVar1 = conv_params->fwd_offset;
  auVar22._4_4_ = iVar1;
  auVar22._0_4_ = iVar1;
  auVar22._8_4_ = iVar1;
  auVar22._12_4_ = iVar1;
  auVar22._16_4_ = iVar1;
  auVar22._20_4_ = iVar1;
  auVar22._24_4_ = iVar1;
  auVar22._28_4_ = iVar1;
  iVar1 = conv_params->bck_offset;
  auVar23._4_4_ = iVar1;
  auVar23._0_4_ = iVar1;
  auVar23._8_4_ = iVar1;
  auVar23._12_4_ = iVar1;
  auVar23._16_4_ = iVar1;
  auVar23._20_4_ = iVar1;
  auVar23._24_4_ = iVar1;
  auVar23._28_4_ = iVar1;
  iVar1 = conv_params->use_dist_wtd_comp_avg;
  auVar24._4_4_ = iVar14;
  auVar24._0_4_ = iVar14;
  auVar24._8_4_ = iVar14;
  auVar24._12_4_ = iVar14;
  auVar24._16_4_ = iVar14;
  auVar24._20_4_ = iVar14;
  auVar24._24_4_ = iVar14;
  auVar24._28_4_ = iVar14;
  auVar25._0_2_ = (undefined2)iVar14;
  auVar25._2_2_ = auVar25._0_2_;
  auVar25._4_2_ = auVar25._0_2_;
  auVar25._6_2_ = auVar25._0_2_;
  auVar25._8_2_ = auVar25._0_2_;
  auVar25._10_2_ = auVar25._0_2_;
  auVar25._12_2_ = auVar25._0_2_;
  auVar25._14_2_ = auVar25._0_2_;
  auVar25._16_2_ = auVar25._0_2_;
  auVar25._18_2_ = auVar25._0_2_;
  auVar25._20_2_ = auVar25._0_2_;
  auVar25._22_2_ = auVar25._0_2_;
  auVar25._24_2_ = auVar25._0_2_;
  auVar25._26_2_ = auVar25._0_2_;
  auVar25._28_2_ = auVar25._0_2_;
  auVar25._30_2_ = auVar25._0_2_;
  auVar27._4_4_ = iVar18;
  auVar27._0_4_ = iVar18;
  auVar27._8_4_ = iVar18;
  auVar27._12_4_ = iVar18;
  auVar27._16_4_ = iVar18;
  auVar27._20_4_ = iVar18;
  auVar27._24_4_ = iVar18;
  auVar27._28_4_ = iVar18;
  auVar26._2_2_ = uVar11;
  auVar26._0_2_ = uVar11;
  auVar26._4_2_ = uVar11;
  auVar26._6_2_ = uVar11;
  auVar26._8_2_ = uVar11;
  auVar26._10_2_ = uVar11;
  auVar26._12_2_ = uVar11;
  auVar26._14_2_ = uVar11;
  auVar26._16_2_ = uVar11;
  auVar26._18_2_ = uVar11;
  auVar26._20_2_ = uVar11;
  auVar26._22_2_ = uVar11;
  auVar26._24_2_ = uVar11;
  auVar26._26_2_ = uVar11;
  auVar26._28_2_ = uVar11;
  auVar26._30_2_ = uVar11;
  auVar21 = ZEXT416(uVar12);
  if ((w & 0xfU) == 0) {
    auVar27 = vpsubd_avx2(auVar27,auVar24);
    uVar19 = 0;
    uVar9 = (ulong)(uint)h;
    if (h < 1) {
      uVar9 = uVar19;
    }
    pCVar15 = pCVar6;
    for (; uVar19 != uVar9; uVar19 = uVar19 + 1) {
      for (lVar5 = 0; lVar5 < w; lVar5 = lVar5 + 0x10) {
        auVar30 = vpsllw_avx2(*(undefined1 (*) [32])(src + lVar5),ZEXT416(uVar12));
        if (iVar2 == 0) {
          auVar30 = vpaddusw_avx2(auVar30,auVar25);
          puVar16 = pCVar6 + uVar19 * lVar20;
        }
        else {
          auVar28 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar29 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pCVar15 + lVar5),auVar28);
          auVar31 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pCVar15 + lVar5),auVar28);
          auVar33 = vpunpcklwd_avx2(auVar30,auVar28);
          auVar33 = vpaddd_avx2(auVar33,auVar24);
          auVar30 = vpunpckhwd_avx2(auVar30,auVar28);
          if (iVar1 == 0) {
            auVar33 = vpaddd_avx2(auVar33,auVar29);
            auVar29 = vpsrad_avx2(auVar33,1);
            auVar33 = vpaddd_avx2(auVar31,auVar24);
            auVar30 = vpaddd_avx2(auVar33,auVar30);
            auVar30 = vpsrad_avx2(auVar30,1);
          }
          else {
            auVar29 = vpmulld_avx2(auVar22,auVar29);
            auVar33 = vpmulld_avx2(auVar33,auVar23);
            auVar33 = vpaddd_avx2(auVar29,auVar33);
            auVar29 = vpsrad_avx2(auVar33,4);
            auVar30 = vpaddd_avx2(auVar30,auVar24);
            auVar33 = vpmulld_avx2(auVar22,auVar31);
            auVar30 = vpmulld_avx2(auVar30,auVar23);
            auVar30 = vpaddd_avx2(auVar33,auVar30);
            auVar30 = vpsrad_avx2(auVar30,4);
          }
          auVar33 = vpaddd_avx2(auVar29,auVar27);
          auVar33 = vpsrad_avx2(auVar33,ZEXT416(uVar12));
          auVar30 = vpaddd_avx2(auVar30,auVar27);
          auVar30 = vpsrad_avx2(auVar30,auVar21);
          auVar30 = vpackusdw_avx2(auVar33,auVar30);
          auVar30 = vpminsw_avx2(auVar30,auVar26);
          puVar16 = dst0 + uVar19 * (long)dst_stride0;
        }
        *(undefined1 (*) [32])(puVar16 + lVar5) = auVar30;
      }
      pCVar15 = pCVar15 + lVar20;
      src = src + src_stride;
    }
  }
  else if ((w & 3U) == 0) {
    auVar27 = vpsubd_avx2(auVar27,auVar24);
    lVar5 = (long)dst_stride0;
    lVar8 = (long)src_stride;
    puVar16 = src + lVar8;
    pCVar15 = pCVar6 + lVar20;
    puVar17 = dst0 + lVar5;
    for (lVar7 = 0; lVar7 < h; lVar7 = lVar7 + 2) {
      for (lVar10 = 0; lVar10 < w; lVar10 = lVar10 + 8) {
        auVar30._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(puVar16 + lVar10) +
             ZEXT116(1) * *(undefined1 (*) [16])(src + lVar10);
        auVar30._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(puVar16 + lVar10);
        auVar33 = vpsllw_avx2(auVar30,auVar21);
        auVar29 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar31 = vpunpcklwd_avx2(auVar33,auVar29);
        auVar30 = vpaddusw_avx2(auVar33,auVar25);
        if ((long)w + -8 < lVar10) {
          if (iVar2 == 0) {
            *(long *)(pCVar6 + lVar10) = auVar30._0_8_;
            *(long *)(pCVar15 + lVar10) = auVar30._16_8_;
          }
          else {
            auVar32._8_8_ = 0;
            auVar32._0_8_ = *(ulong *)(pCVar15 + lVar10);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)(pCVar6 + lVar10);
            auVar33._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar34;
            auVar33._16_16_ = ZEXT116(1) * auVar32;
            auVar33 = vpunpcklwd_avx2(auVar33,auVar29);
            auVar30 = vpaddd_avx2(auVar31,auVar24);
            if (iVar1 == 0) {
              auVar30 = vpaddd_avx2(auVar30,auVar33);
              auVar30 = vpsrad_avx2(auVar30,1);
            }
            else {
              auVar33 = vpmulld_avx2(auVar22,auVar33);
              auVar30 = vpmulld_avx2(auVar30,auVar23);
              auVar30 = vpaddd_avx2(auVar33,auVar30);
              auVar30 = vpsrad_avx2(auVar30,4);
            }
            auVar30 = vpaddd_avx2(auVar30,auVar27);
            auVar30 = vpsrad_avx2(auVar30,auVar21);
            auVar30 = vpackusdw_avx2(auVar30,auVar30);
            auVar30 = vpminsw_avx2(auVar30,auVar26);
            *(long *)(dst0 + lVar10) = auVar30._0_8_;
            *(long *)(puVar17 + lVar10) = auVar30._16_8_;
          }
        }
        else if (iVar2 == 0) {
          *(undefined1 (*) [16])(pCVar6 + lVar10) = auVar30._0_16_;
          *(undefined1 (*) [16])(pCVar15 + lVar10) = auVar30._16_16_;
        }
        else {
          auVar28._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(pCVar15 + lVar10) +
               ZEXT116(1) * *(undefined1 (*) [16])(pCVar6 + lVar10);
          auVar28._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(pCVar15 + lVar10);
          auVar3 = vpunpcklwd_avx2(auVar28,auVar29);
          auVar28 = vpunpckhwd_avx2(auVar28,auVar29);
          auVar30 = vpaddd_avx2(auVar31,auVar24);
          auVar33 = vpunpckhwd_avx2(auVar33,auVar29);
          if (iVar1 == 0) {
            auVar30 = vpaddd_avx2(auVar30,auVar3);
            auVar31 = vpsrad_avx2(auVar30,1);
            auVar30 = vpaddd_avx2(auVar28,auVar24);
            auVar30 = vpaddd_avx2(auVar30,auVar33);
            auVar30 = vpsrad_avx2(auVar30,1);
          }
          else {
            auVar31 = vpmulld_avx2(auVar22,auVar3);
            auVar30 = vpmulld_avx2(auVar30,auVar23);
            auVar30 = vpaddd_avx2(auVar31,auVar30);
            auVar31 = vpsrad_avx2(auVar30,4);
            auVar30 = vpaddd_avx2(auVar33,auVar24);
            auVar33 = vpmulld_avx2(auVar22,auVar28);
            auVar30 = vpmulld_avx2(auVar30,auVar23);
            auVar30 = vpaddd_avx2(auVar33,auVar30);
            auVar30 = vpsrad_avx2(auVar30,4);
          }
          auVar33 = vpaddd_avx2(auVar31,auVar27);
          auVar33 = vpsrad_avx2(auVar33,auVar21);
          auVar30 = vpaddd_avx2(auVar30,auVar27);
          auVar30 = vpsrad_avx2(auVar30,auVar21);
          auVar30 = vpackusdw_avx2(auVar33,auVar30);
          auVar30 = vpminsw_avx2(auVar30,auVar26);
          *(undefined1 (*) [16])(dst0 + lVar10) = auVar30._0_16_;
          *(undefined1 (*) [16])(puVar17 + lVar10) = auVar30._16_16_;
        }
      }
      puVar16 = puVar16 + lVar8 * 2;
      src = src + lVar8 * 2;
      pCVar15 = pCVar15 + lVar20 * 2;
      pCVar6 = pCVar6 + lVar20 * 2;
      puVar17 = puVar17 + lVar5 * 2;
      dst0 = dst0 + lVar5 * 2;
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_avx2(const uint16_t *src,
                                               int src_stride, uint16_t *dst0,
                                               int dst_stride0, int w, int h,
                                               ConvolveParams *conv_params,
                                               int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const __m256i offset_const_16b = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 16)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 16) {
        const __m256i src_16bit =
            _mm256_loadu_si256((__m256i *)(&src[i * src_stride + j]));

        const __m256i res = _mm256_sll_epi16(src_16bit, left_shift);

        if (do_average) {
          const __m256i data_0 =
              _mm256_loadu_si256((__m256i *)(&dst[i * dst_stride + j]));

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_0, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_0, zero);

          const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
          const __m256i res_unsigned_lo =
              _mm256_add_epi32(res_32b_lo, offset_const);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
          const __m256i res_unsigned_hi =
              _mm256_add_epi32(res_32b_hi, offset_const);

          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          _mm256_store_si256((__m256i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m256i res_unsigned_16b =
              _mm256_adds_epu16(res, offset_const_16b);

          _mm256_store_si256((__m256i *)(&dst[i * dst_stride + j]),
                             res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_row_0 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j + src_stride]));
        // since not all compilers yet support _mm256_set_m128i()
        const __m256i src_10 = _mm256_insertf128_si256(
            _mm256_castsi128_si256(src_row_0), src_row_1, 1);

        const __m256i res = _mm256_sll_epi16(src_10, left_shift);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i res_32b = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b, offset_const);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);

            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b_lo, offset_const);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
            const __m256i res_unsigned_hi =
                _mm256_add_epi32(res_32b_hi, offset_const);

            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
      }
    }
  }
}